

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * chapter2::pent_series(int pos)

{
  undefined8 in_RAX;
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (pent_series(int)::elem == '\0') {
    iVar2 = __cxa_guard_acquire(&pent_series(int)::elem);
    if (iVar2 != 0) {
      pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<int,_std::allocator<int>_>::~vector,&pent_series::elem,&__dso_handle)
      ;
      __cxa_guard_release(&pent_series(int)::elem);
    }
  }
  if (((uint)pos < 0x41) &&
     (uVar1 = (long)pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2, uVar1 < (uint)pos)) {
    iVar2 = (int)uVar1;
    iVar3 = iVar2 * 3 + 2;
    while (iVar2 = iVar2 + 1, iVar2 <= pos) {
      uStack_38 = CONCAT44((iVar3 * iVar2) / 2,(undefined4)uStack_38);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&pent_series::elem,(int *)((long)&uStack_38 + 4));
      iVar3 = iVar3 + 3;
    }
  }
  return &pent_series::elem;
}

Assistant:

const vector<int> * pent_series(int pos) {
        static vector<int> elem;
        if (check_validity(pos) && pos > elem.size()) {
            for (int ix = static_cast<int>(elem.size() + 1); ix <= pos; ++ix) {
                elem.push_back(ix * (3 * ix - 1) / 2);
            }
        }

        return &elem;
    }